

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O3

void Fxu_ListDoubleDelPair(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  int *piVar1;
  Fxu_Pair *pFVar2;
  Fxu_Pair *pFVar3;
  
  if ((pDiv->lPairs).pHead == pLink) {
    (pDiv->lPairs).pHead = pLink->pDNext;
  }
  pFVar2 = pLink->pDPrev;
  if ((pDiv->lPairs).pTail == pLink) {
    (pDiv->lPairs).pTail = pFVar2;
  }
  pFVar3 = pLink->pDNext;
  if (pFVar2 != (Fxu_Pair *)0x0) {
    pFVar2->pDNext = pFVar3;
  }
  if (pFVar3 != (Fxu_Pair *)0x0) {
    pFVar3->pDPrev = pFVar2;
  }
  piVar1 = &(pDiv->lPairs).nItems;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void Fxu_ListDoubleDelPair( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
    Fxu_ListPair * pList = &pDiv->lPairs;
    if ( pList->pHead == pLink )
         pList->pHead = pLink->pDNext;
    if ( pList->pTail == pLink )
         pList->pTail = pLink->pDPrev;
    if ( pLink->pDPrev )
         pLink->pDPrev->pDNext = pLink->pDNext;
    if ( pLink->pDNext )
         pLink->pDNext->pDPrev = pLink->pDPrev;
    pList->nItems--;
}